

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O1

char * google::protobuf::internal::TcParser::
       MessageSetWireFormatParseLoopImpl<google::protobuf::MessageLite>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData param_4,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char *pcVar1;
  ExtensionSet *this;
  
  this = (ExtensionSet *)((long)&msg->_vptr_MessageLite + (ulong)table->extension_offset);
  if (((ulong)this & 7) == 0) {
    pcVar1 = ExtensionSet::ParseMessageSet<google::protobuf::MessageLite>
                       (this,ptr,table->class_data->prototype,&msg->_internal_metadata_,ctx);
    return pcVar1;
  }
  AlignFail();
}

Assistant:

PROTOBUF_CC static const char* MessageSetWireFormatParseLoopImpl(
      PROTOBUF_TC_PARAM_NO_DATA_DECL) {
    return RefAt<ExtensionSet>(msg, table->extension_offset)
        .ParseMessageSet(
            ptr, static_cast<const MessageBaseT*>(table->default_instance()),
            &msg->_internal_metadata_, ctx);
  }